

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O3

void __thiscall
TPZFYsmpMatrix<long_double>::AddKel
          (TPZFYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  long lVar1;
  long *plVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  longdouble *plVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  
  lVar11 = sourceindex->fNElements;
  if (0 < lVar11) {
    lVar13 = 0;
    lVar9 = 0;
    do {
      if (0 < lVar11) {
        lVar14 = 0;
        lVar15 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        do {
          in_ST4 = in_ST5;
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          lVar11 = destinationindex->fStore[lVar13];
          lVar1 = destinationindex->fStore[lVar14];
          (*(elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(elmat,sourceindex->fStore[lVar13],sourceindex->fStore[lVar14]);
          in_ST5 = in_ST4;
          if ((longdouble)1e-16 <= ABS(lVar15)) {
            lVar12 = lVar9 + 1;
            plVar2 = (this->fIA).fStore;
            lVar7 = plVar2[lVar11];
            lVar11 = plVar2[lVar11 + 1];
            if (((lVar12 < lVar7) || (lVar11 <= lVar12)) || ((this->fJA).fStore[lVar9 + 1] != lVar1)
               ) {
              lVar9 = lVar7;
              if (lVar7 < lVar11) {
                plVar2 = (this->fJA).fStore;
                lVar12 = lVar7 * 8;
                do {
                  lVar9 = *(long *)((long)plVar2 + lVar12);
                  if (lVar9 == lVar1) {
                    if (lVar1 == -1) goto LAB_00d58fff;
                    plVar10 = (this->fA).fStore;
                    lVar15 = *(longdouble *)((long)plVar10 + lVar12 * 2) + lVar15;
LAB_00d5900c:
                    *(longdouble *)((long)plVar10 + lVar12 * 2) = lVar15;
                    lVar9 = lVar7;
                    goto LAB_00d5900f;
                  }
                  if (lVar9 == -1) {
LAB_00d58fff:
                    *(long *)((long)plVar2 + lVar12) = lVar1;
                    plVar10 = (this->fA).fStore;
                    goto LAB_00d5900c;
                  }
                  lVar7 = lVar7 + 1;
                  lVar12 = lVar12 + 8;
                  lVar9 = lVar11;
                } while (lVar11 != lVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =",
                         0x46);
              poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," column =",9);
              poVar8 = std::ostream::_M_insert<long>((long)poVar8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
            else {
              plVar10 = (this->fA).fStore;
              plVar10[lVar12] = plVar10[lVar12] + lVar15;
              lVar9 = lVar12;
            }
          }
LAB_00d5900f:
          lVar14 = lVar14 + 1;
          lVar11 = sourceindex->fNElements;
          lVar15 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
        } while (lVar14 < lVar11);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < lVar11);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & sourceindex, TPZVec<int64_t> & destinationindex){
	int64_t i,j,k = 0;
	TVar value=0.;
	int64_t ipos,jpos;
	for(i=0;i<sourceindex.NElements();i++){
		for(j=0;j<sourceindex.NElements();j++){
			ipos=destinationindex[i];
			jpos=destinationindex[j];
			value=elmat.GetVal(sourceindex[i],sourceindex[j]);
            //cout << "j= " << j << endl;
			if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
				int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
				if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
		}
	}
}